

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O2

void __thiscall
tchecker::syncprod::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
state_pool_allocator_t
          (state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           *this,size_t state_alloc_nb,size_t vloc_alloc_nb,size_t vloc_capacity,size_t table_size)

{
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *this_00;
  value_type vStack_38;
  
  tchecker::ts::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  state_pool_allocator_t
            (&this->
              super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
             ,state_alloc_nb);
  this->_vloc_capacity = vloc_capacity;
  pool_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::pool_t
            (&this->_vloc_pool,vloc_alloc_nb,(vloc_capacity & 0xffffffff) * 4 + 0x10);
  this_00 = (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
             *)operator_new(0x58);
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  ::periodic_collectable_cache_t(this_00,table_size);
  std::
  __shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            ((__shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,(__gnu_cxx::_Lock_policy)2>
              *)&this->_vloc_cache,this_00);
  std::__shared_ptr<tchecker::collectable_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            ((__shared_ptr<tchecker::collectable_t,(__gnu_cxx::_Lock_policy)2> *)&vStack_38,
             &(this->_vloc_cache).
              super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
            );
  std::
  vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
  ::push_back(&(this->_vloc_pool)._collectables,&vStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vStack_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

state_pool_allocator_t(std::size_t state_alloc_nb, std::size_t vloc_alloc_nb, std::size_t vloc_capacity,
                         std::size_t table_size)
      : tchecker::ts::state_pool_allocator_t<STATE>(state_alloc_nb), _vloc_capacity(vloc_capacity),
        _vloc_pool(vloc_alloc_nb, tchecker::allocation_size_t<tchecker::shared_vloc_t>::alloc_size(_vloc_capacity)),
        _vloc_cache(new vloc_cache_t(table_size))

  {
    _vloc_pool.enroll(_vloc_cache);
  }